

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::OpenPopupEx(char *str_id,bool reopen_existing)

{
  ImVector<ImGuiPopupRef> *this;
  int i;
  ImGuiWindow *this_00;
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  ImGuiID IVar3;
  value_type *pvVar4;
  value_type local_50;
  
  pIVar2 = GImGui;
  this_00 = GImGui->CurrentWindow;
  IVar3 = ImGuiWindow::GetID(this_00,str_id,(char *)0x0);
  i = (pIVar2->CurrentPopupStack).Size;
  local_50.ParentMenuSet = ImGuiWindow::GetID(this_00,"##menus",(char *)0x0);
  local_50.Window = (ImGuiWindow *)0x0;
  IVar1 = (pIVar2->IO).MousePos;
  local_50.MousePosOnOpen.x = IVar1.x;
  local_50.MousePosOnOpen.y = IVar1.y;
  this = &pIVar2->OpenPopupStack;
  local_50.PopupId = IVar3;
  local_50.ParentWindow = this_00;
  if (i < (pIVar2->OpenPopupStack).Size) {
    if ((!reopen_existing) &&
       (pvVar4 = ImVector<ImGuiPopupRef>::operator[](this,i), pvVar4->PopupId == IVar3)) {
      return;
    }
    ImVector<ImGuiPopupRef>::resize(this,i + 1);
    pvVar4 = ImVector<ImGuiPopupRef>::operator[](this,i);
    *(ulong *)pvVar4 = CONCAT44(local_50._4_4_,local_50.PopupId);
    pvVar4->Window = local_50.Window;
    pvVar4->ParentWindow = local_50.ParentWindow;
    pvVar4->ParentMenuSet = local_50.ParentMenuSet;
    (pvVar4->MousePosOnOpen).x = local_50.MousePosOnOpen.x;
    (pvVar4->MousePosOnOpen).y = local_50.MousePosOnOpen.y;
  }
  else {
    ImVector<ImGuiPopupRef>::push_back(this,&local_50);
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(const char* str_id, bool reopen_existing)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetID(str_id);
    int current_stack_size = g.CurrentPopupStack.Size;
    ImGuiPopupRef popup_ref = ImGuiPopupRef(id, window, window->GetID("##menus"), g.IO.MousePos); // Tagged as new ref because constructor sets Window to NULL (we are passing the ParentWindow info here)
    if (g.OpenPopupStack.Size < current_stack_size + 1)
        g.OpenPopupStack.push_back(popup_ref);
    else if (reopen_existing || g.OpenPopupStack[current_stack_size].PopupId != id)
    {
        g.OpenPopupStack.resize(current_stack_size+1);
        g.OpenPopupStack[current_stack_size] = popup_ref;
    }
}